

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O0

HPDF_STATUS InternalSaveToStream(HPDF_Doc pdf,HPDF_Stream_conflict stream)

{
  HPDF_Encrypt e_00;
  HPDF_STATUS HVar1;
  HPDF_Encrypt e;
  HPDF_STATUS ret;
  HPDF_Stream_conflict stream_local;
  HPDF_Doc pdf_local;
  
  if ((((pdf->pdfa_type == HPDF_PDFA_NON_PDFA) ||
       (pdf_local = (HPDF_Doc)HPDF_PDFA_AddXmpMetadata(pdf), pdf_local == (HPDF_Doc)0x0)) &&
      (pdf_local = (HPDF_Doc)WriteHeader(pdf,stream), pdf_local == (HPDF_Doc)0x0)) &&
     (pdf_local = (HPDF_Doc)PrepareTrailer(pdf), pdf_local == (HPDF_Doc)0x0)) {
    if (pdf->encrypt_on == 0) {
      pdf_local = (HPDF_Doc)HPDF_Xref_WriteToStream(pdf->xref,stream,(HPDF_Encrypt)0x0);
    }
    else {
      e_00 = HPDF_EncryptDict_GetAttr(pdf->encrypt_dict);
      HVar1 = HPDF_Doc_PrepareEncryption(pdf);
      if (HVar1 != 0) {
        return HVar1;
      }
      pdf_local = (HPDF_Doc)HPDF_Xref_WriteToStream(pdf->xref,stream,e_00);
    }
    if (pdf_local == (HPDF_Doc)0x0) {
      pdf_local = (HPDF_Doc)0x0;
    }
  }
  return (HPDF_STATUS)pdf_local;
}

Assistant:

static HPDF_STATUS
InternalSaveToStream  (HPDF_Doc      pdf,
                       HPDF_Stream   stream)
{
    HPDF_STATUS ret;

    /* Add metadata in case of PDF/A document */
    if (pdf->pdfa_type != HPDF_PDFA_NON_PDFA && (ret = HPDF_PDFA_AddXmpMetadata(pdf)) != HPDF_OK)
        return ret;

    if ((ret = WriteHeader (pdf, stream)) != HPDF_OK)
        return ret;

    /* prepare trailer */
    if ((ret = PrepareTrailer (pdf)) != HPDF_OK)
        return ret;

    /* prepare encryption */
    if (pdf->encrypt_on) {
        HPDF_Encrypt e= HPDF_EncryptDict_GetAttr (pdf->encrypt_dict);

        if ((ret = HPDF_Doc_PrepareEncryption (pdf)) != HPDF_OK)
            return ret;

        if ((ret = HPDF_Xref_WriteToStream (pdf->xref, stream, e)) != HPDF_OK)
            return ret;
    } else {
        if ((ret = HPDF_Xref_WriteToStream (pdf->xref, stream, NULL)) !=
                HPDF_OK)
            return ret;
    }

    return HPDF_OK;
}